

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

CURLcode connect_SOCKS(Curl_easy *data,int sockindex,_Bool *done)

{
  connectdata *pcVar1;
  CURLproxycode CVar2;
  uint uVar3;
  char *hostname;
  
  pcVar1 = data->conn;
  uVar3 = *(uint *)&(pcVar1->bits).field_0x4;
  if ((uVar3 & 2) == 0) {
    *done = true;
    return CURLE_OK;
  }
  if ((uVar3 & 1) != 0) {
    hostname = (pcVar1->http_proxy).host.name;
    uVar3 = (uint)(pcVar1->http_proxy).port;
    goto LAB_00454490;
  }
  if ((uVar3 >> 9 & 1) == 0) {
    if (sockindex != 1) {
      hostname = (pcVar1->host).name;
LAB_0045447c:
      if ((uVar3 >> 10 & 1) == 0) {
        uVar3 = pcVar1->remote_port;
      }
      else {
        uVar3 = pcVar1->conn_to_port;
      }
      goto LAB_00454490;
    }
    hostname = pcVar1->secondaryhostname;
  }
  else {
    hostname = (pcVar1->conn_to_host).name;
    if (sockindex != 1) goto LAB_0045447c;
  }
  uVar3 = (uint)pcVar1->secondary_port;
LAB_00454490:
  switch((pcVar1->socks_proxy).proxytype) {
  case '\x04':
  case '\x06':
    CVar2 = Curl_SOCKS4((pcVar1->socks_proxy).user,hostname,uVar3,sockindex,data,done);
    break;
  case '\x05':
  case '\a':
    CVar2 = Curl_SOCKS5((pcVar1->socks_proxy).user,(pcVar1->socks_proxy).passwd,hostname,uVar3,
                        sockindex,data,done);
    break;
  default:
    Curl_failf(data,"unknown proxytype option given");
    return CURLE_COULDNT_CONNECT;
  }
  if (CVar2 == CURLPX_OK) {
    return CURLE_OK;
  }
  (data->info).pxcode = CVar2;
  return CURLE_PROXY;
}

Assistant:

static CURLcode connect_SOCKS(struct Curl_easy *data, int sockindex,
                              bool *done)
{
  CURLcode result = CURLE_OK;
#ifndef CURL_DISABLE_PROXY
  CURLproxycode pxresult = CURLPX_OK;
  struct connectdata *conn = data->conn;
  if(conn->bits.socksproxy) {
    /* for the secondary socket (FTP), use the "connect to host"
     * but ignore the "connect to port" (use the secondary port)
     */
    const char * const host =
      conn->bits.httpproxy ?
      conn->http_proxy.host.name :
      conn->bits.conn_to_host ?
      conn->conn_to_host.name :
      sockindex == SECONDARYSOCKET ?
      conn->secondaryhostname : conn->host.name;
    const int port =
      conn->bits.httpproxy ? (int)conn->http_proxy.port :
      sockindex == SECONDARYSOCKET ? conn->secondary_port :
      conn->bits.conn_to_port ? conn->conn_to_port :
      conn->remote_port;
    switch(conn->socks_proxy.proxytype) {
    case CURLPROXY_SOCKS5:
    case CURLPROXY_SOCKS5_HOSTNAME:
      pxresult = Curl_SOCKS5(conn->socks_proxy.user, conn->socks_proxy.passwd,
                             host, port, sockindex, data, done);
      break;

    case CURLPROXY_SOCKS4:
    case CURLPROXY_SOCKS4A:
      pxresult = Curl_SOCKS4(conn->socks_proxy.user, host, port, sockindex,
                             data, done);
      break;

    default:
      failf(data, "unknown proxytype option given");
      result = CURLE_COULDNT_CONNECT;
    } /* switch proxytype */
    if(pxresult) {
      result = CURLE_PROXY;
      data->info.pxcode = pxresult;
    }
  }
  else
#else
    (void)data;
    (void)sockindex;
#endif /* CURL_DISABLE_PROXY */
    *done = TRUE; /* no SOCKS proxy, so consider us connected */

  return result;
}